

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Tree::lookup_result::resolved(lookup_result *this)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  ulong len_;
  csubstr cVar4;
  basic_substring<const_char> local_20;
  
  uVar1 = this->path_pos;
  len_ = (this->path).len;
  if (uVar1 == 0xffffffffffffffff || uVar1 <= len_) {
    if (uVar1 != 0xffffffffffffffff) {
      len_ = uVar1;
    }
    basic_substring<const_char>::basic_substring(&local_20,(this->path).str,len_);
    if (local_20.len == 0) {
      local_20.len = 0;
    }
    else if (local_20.str[local_20.len - 1] == '.') {
      basic_substring<const_char>::basic_substring(&local_20,local_20.str,local_20.len - 1);
    }
    cVar4.len = local_20.len;
    cVar4.str = local_20.str;
    return cVar4;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      cVar4 = (csubstr)(*pcVar2)();
      return cVar4;
    }
  }
  handle_error(0x1e7ac6,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x154e,"num <= len || num == npos");
}

Assistant:

csubstr Tree::lookup_result::resolved() const
{
    csubstr p = path.first(path_pos);
    if(p.ends_with('.'))
        p = p.first(p.len-1);
    return p;
}